

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::UntypedMapBase::EraseFromTree
          (UntypedMapBase *this,map_index_t b,iterator tree_it)

{
  NodeBase *node;
  bool bVar1;
  reference ppVar2;
  TableEntryPtr TVar3;
  undefined8 uVar4;
  NodeBase *pNVar5;
  GetKey get_key;
  UntypedMapBase *this_00;
  btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *pbVar6;
  iterator iVar7;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  bStack_b0;
  undefined1 auStack_98 [8];
  UntypedMapBase UStack_90;
  VariantKey VStack_70;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  local_40;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  local_30;
  
  pNVar5 = tree_it._8_8_;
  local_40.node_ = tree_it.node_;
  local_40.position_ = tree_it.position_;
  TVar3 = this->table_[b];
  if ((TVar3 & 1) != 0) {
    pbVar6 = (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
              *)(TVar3 - 1);
    iVar7 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
            ::begin(pbVar6);
    bVar1 = absl::lts_20240722::container_internal::
            btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
            ::Equals(&local_40,(const_iterator)iVar7);
    if (!bVar1) {
      local_30.node_ = local_40.node_;
      local_30.position_ = local_40.position_;
      absl::lts_20240722::container_internal::
      btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
      ::decrement(&local_30);
      ppVar2 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
               ::operator*(&local_30);
      ppVar2->second->next = ppVar2->second->next->next;
    }
    iVar7.position_ = local_40.position_;
    iVar7.node_ = local_40.node_;
    iVar7._12_4_ = 0;
    absl::lts_20240722::container_internal::
    btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
    ::erase(pbVar6,iVar7);
    if (*(long *)(TVar3 + 0x17) == 0) {
      DestroyTree(this,(Tree *)pbVar6);
      this->table_[b] = 0;
    }
    return;
  }
  this_00 = (UntypedMapBase *)&local_30;
  EraseFromTree(this_00);
  node = (NodeBase *)this_00->table_[b];
  auStack_98 = (undefined1  [8])pNVar5;
  if (((ulong)node & 1) == 0 && node != (NodeBase *)0x0) {
    TVar3 = ConvertToTree(this_00,node,get_key);
    this_00->table_[b] = TVar3;
  }
  if ((this_00->table_[b] & 1) == 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)(auStack_98 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/map.cc"
               ,0x3c,0x13,"TableEntryIsTree(b)");
    bStack_b0.node_ =
         (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
          *)this_00->table_[b];
    uVar4 = _ZN4absl12lts_2024072212log_internal10LogMessagelsIPvTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS6_
                      ((LogMessageFatal *)(auStack_98 + 8));
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(uVar4,1," ");
    bStack_b0.node_ =
         (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
          *)this_00->table_[b];
    _ZN4absl12lts_2024072212log_internal10LogMessagelsImTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
              (uVar4);
  }
  else {
    if ((this_00->table_[b] & 1) != 0) {
      pbVar6 = (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                *)(this_00->table_[b] - 1);
      VStack_70 = (*get_key)((NodeBase *)auStack_98);
      bStack_b0.node_ =
           (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
            *)&VStack_70;
      UStack_90.alloc_.arena_ = (Arena *)auStack_98;
      absl::lts_20240722::container_internal::
      btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,google::protobuf::internal::NodeBase*,std::less<google::protobuf::internal::VariantKey>,google::protobuf::internal::MapAllocator<std::pair<google::protobuf::internal::VariantKey_const,google::protobuf::internal::NodeBase*>>,256,false>>
      ::
      insert_unique<google::protobuf::internal::VariantKey,std::piecewise_construct_t_const&,std::tuple<google::protobuf::internal::VariantKey&&>,std::tuple<google::protobuf::internal::NodeBase*&>>
                ((pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>,_bool>
                  *)(auStack_98 + 8),
                 (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,google::protobuf::internal::NodeBase*,std::less<google::protobuf::internal::VariantKey>,google::protobuf::internal::MapAllocator<std::pair<google::protobuf::internal::VariantKey_const,google::protobuf::internal::NodeBase*>>,256,false>>
                  *)pbVar6,(VariantKey *)bStack_b0.node_,
                 (piecewise_construct_t *)&std::piecewise_construct,
                 (tuple<google::protobuf::internal::VariantKey_&&> *)&bStack_b0,
                 (tuple<google::protobuf::internal::NodeBase_*&> *)&UStack_90.alloc_);
      bStack_b0.position_ = UStack_90.seed_;
      bStack_b0.node_ =
           (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
            *)UStack_90._0_8_;
      iVar7 = absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
              ::begin(pbVar6);
      bVar1 = absl::lts_20240722::container_internal::
              btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
              ::Equals(&bStack_b0,(const_iterator)iVar7);
      if (!bVar1) {
        UStack_90._0_8_ = bStack_b0.node_;
        UStack_90.seed_ = bStack_b0.position_;
        absl::lts_20240722::container_internal::
        btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
        ::decrement((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                     *)(auStack_98 + 8));
        ppVar2 = absl::lts_20240722::container_internal::
                 btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                 ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                              *)(auStack_98 + 8));
        ppVar2->second->next = (NodeBase *)auStack_98;
      }
      UStack_90._0_8_ = bStack_b0.node_;
      UStack_90.seed_ = bStack_b0.position_;
      absl::lts_20240722::container_internal::
      btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
      ::increment((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                   *)(auStack_98 + 8));
      iVar7 = absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
              ::end(pbVar6);
      bVar1 = absl::lts_20240722::container_internal::
              btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
              ::Equals((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                        *)(auStack_98 + 8),(const_iterator)iVar7);
      if (bVar1) {
        pNVar5 = (NodeBase *)0x0;
      }
      else {
        ppVar2 = absl::lts_20240722::container_internal::
                 btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                 ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
                              *)(auStack_98 + 8));
        pNVar5 = ppVar2->second;
      }
      *(NodeBase **)auStack_98 = pNVar5;
      return;
    }
    InsertUniqueInTree((UntypedMapBase *)(auStack_98 + 8));
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)(auStack_98 + 8));
}

Assistant:

void UntypedMapBase::EraseFromTree(map_index_t b,
                                   typename Tree::iterator tree_it) {
  ABSL_DCHECK(TableEntryIsTree(b));
  Tree* tree = TableEntryToTree(table_[b]);
  if (tree_it != tree->begin()) {
    NodeBase* prev = std::prev(tree_it)->second;
    prev->next = prev->next->next;
  }
  tree->erase(tree_it);
  if (tree->empty()) {
    DestroyTree(tree);
    table_[b] = TableEntryPtr{};
  }
}